

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseTemplateArg(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  State *in_stack_00000068;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb1;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 in_stack_ffffffffffffffb3;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  undefined8 uVar6;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar7;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar5 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar5) {
    bVar7 = 0;
  }
  else {
    uVar1 = (in_RDI->parse_state).mangled_idx;
    uVar2 = (in_RDI->parse_state).out_cur_idx;
    uVar6 = *(undefined8 *)&(in_RDI->parse_state).prev_name_idx;
    bVar5 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar6 >> 0x38));
    if (((bVar5) &&
        (bVar5 = ZeroOrMore((ParseFunc)
                            CONCAT17(in_stack_ffffffffffffffb7,
                                     CONCAT16(in_stack_ffffffffffffffb6,
                                              CONCAT15(in_stack_ffffffffffffffb5,
                                                       CONCAT14(in_stack_ffffffffffffffb4,
                                                                CONCAT13(in_stack_ffffffffffffffb3,
                                                                         CONCAT12(
                                                  in_stack_ffffffffffffffb2,
                                                  CONCAT11(in_stack_ffffffffffffffb1,
                                                           in_stack_ffffffffffffffb0))))))),
                            (State *)CONCAT17(in_stack_ffffffffffffffaf,
                                              CONCAT16(in_stack_ffffffffffffffae,
                                                       in_stack_ffffffffffffffa8))), bVar5)) &&
       (bVar5 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar6 >> 0x38)), bVar5)) {
      bVar7 = 1;
    }
    else {
      (in_RDI->parse_state).mangled_idx = uVar1;
      (in_RDI->parse_state).out_cur_idx = uVar2;
      *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar6;
      bVar5 = ParseLocalSourceName(in_stack_ffffffffffffffd8);
      if (bVar5) {
        bVar5 = ParseTemplateArgs(in_stack_ffffffffffffffe8.state_);
        bVar5 = Optional(bVar5);
        if (bVar5) {
          iVar3 = (in_RDI->parse_state).mangled_idx;
          iVar4 = (in_RDI->parse_state).out_cur_idx;
          uVar6 = *(undefined8 *)&(in_RDI->parse_state).prev_name_idx;
          bVar5 = ParseExprCastValueAndTrailingE(in_stack_ffffffffffffffe8.state_);
          if (bVar5) {
            bVar7 = 1;
          }
          else {
            (in_RDI->parse_state).mangled_idx = iVar3;
            (in_RDI->parse_state).out_cur_idx = iVar4;
            *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar6;
            bVar7 = 1;
          }
          goto LAB_003d3773;
        }
      }
      bVar5 = ParseType((State *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      if ((bVar5) ||
         (bVar5 = ParseExprPrimary((State *)CONCAT17(in_stack_ffffffffffffffff,
                                                     in_stack_fffffffffffffff8)), bVar5)) {
        bVar7 = 1;
      }
      else {
        (in_RDI->parse_state).mangled_idx = uVar1;
        (in_RDI->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar6;
        bVar5 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar6 >> 0x38));
        if ((bVar5) &&
           ((bVar5 = ParseExpression(in_stack_00000068), bVar5 &&
            (bVar5 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar6 >> 0x38)),
            bVar5)))) {
          bVar7 = 1;
        }
        else {
          (in_RDI->parse_state).mangled_idx = uVar1;
          (in_RDI->parse_state).out_cur_idx = uVar2;
          *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar6;
          bVar5 = ParseTemplateParamDecl(in_stack_ffffffffffffffe8.state_);
          if ((bVar5) && (bVar5 = ParseTemplateArg(in_stack_ffffffffffffffe8.state_), bVar5)) {
            bVar7 = 1;
          }
          else {
            (in_RDI->parse_state).mangled_idx = uVar1;
            (in_RDI->parse_state).out_cur_idx = uVar2;
            *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar6;
            bVar7 = 0;
          }
        }
      }
    }
  }
LAB_003d3773:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return (bool)(bVar7 & 1);
}

Assistant:

static bool ParseTemplateArg(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'J') && ZeroOrMore(ParseTemplateArg, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // There can be significant overlap between the following leading to
  // exponential backtracking:
  //
  //   <expr-primary> ::= L <type> <expr-cast-value> E
  //                 e.g. L 2xxIvE 1                 E
  //   <type>         ==> <local-source-name> <template-args>
  //                 e.g. L 2xx               IvE
  //
  // This means parsing an entire <type> twice, and <type> can contain
  // <template-arg>, so this can generate exponential backtracking.  There is
  // only overlap when the remaining input starts with "L <source-name>", so
  // parse all cases that can start this way jointly to share the common prefix.
  //
  // We have:
  //
  //   <template-arg> ::= <type>
  //                  ::= <expr-primary>
  //
  // First, drop all the productions of <type> that must start with something
  // other than 'L'.  All that's left is <class-enum-type>; inline it.
  //
  //   <type> ::= <nested-name> # starts with 'N'
  //          ::= <unscoped-name>
  //          ::= <unscoped-template-name> <template-args>
  //          ::= <local-name> # starts with 'Z'
  //
  // Drop and inline again:
  //
  //   <type> ::= <unscoped-name>
  //          ::= <unscoped-name> <template-args>
  //          ::= <substitution> <template-args> # starts with 'S'
  //
  // Merge the first two, inline <unscoped-name>, drop last:
  //
  //   <type> ::= <unqualified-name> [<template-args>]
  //          ::= St <unqualified-name> [<template-args>] # starts with 'S'
  //
  // Drop and inline:
  //
  //   <type> ::= <operator-name> [<template-args>] # starts with lowercase
  //          ::= <ctor-dtor-name> [<template-args>] # starts with 'C' or 'D'
  //          ::= <source-name> [<template-args>] # starts with digit
  //          ::= <local-source-name> [<template-args>]
  //          ::= <unnamed-type-name> [<template-args>] # starts with 'U'
  //
  // One more time:
  //
  //   <type> ::= L <source-name> [<template-args>]
  //
  // Likewise with <expr-primary>:
  //
  //   <expr-primary> ::= L <type> <expr-cast-value> E
  //                  ::= LZ <encoding> E # cannot overlap; drop
  //                  ::= L <mangled_name> E # cannot overlap; drop
  //
  // By similar reasoning as shown above, the only <type>s starting with
  // <source-name> are "<source-name> [<template-args>]".  Inline this.
  //
  //   <expr-primary> ::= L <source-name> [<template-args>] <expr-cast-value> E
  //
  // Now inline both of these into <template-arg>:
  //
  //   <template-arg> ::= L <source-name> [<template-args>]
  //                  ::= L <source-name> [<template-args>] <expr-cast-value> E
  //
  // Merge them and we're done:
  //   <template-arg>
  //     ::= L <source-name> [<template-args>] [<expr-cast-value> E]
  if (ParseLocalSourceName(state) && Optional(ParseTemplateArgs(state))) {
    copy = state->parse_state;
    if (ParseExprCastValueAndTrailingE(state)) {
      return true;
    }
    state->parse_state = copy;
    return true;
  }

  // Now that the overlapping cases can't reach this code, we can safely call
  // both of these.
  if (ParseType(state) || ParseExprPrimary(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'X') && ParseExpression(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTemplateParamDecl(state) && ParseTemplateArg(state)) {
    return true;
  }
  state->parse_state = copy;

  return false;
}